

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

void __thiscall
HighsDomain::updateActivityLbChange(HighsDomain *this,HighsInt col,double oldbound,double newbound)

{
  ObjectivePropagation *this_00;
  double *pdVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  HighsLp *pHVar5;
  pointer piVar6;
  _Elt_pointer pCVar7;
  pointer pHVar8;
  _Elt_pointer pCVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  bool bVar11;
  Reason RVar12;
  long lVar13;
  long lVar14;
  _Elt_pointer pCVar15;
  long lVar16;
  int iVar17;
  CutpoolPropagation *cutpoolprop;
  _Elt_pointer this_01;
  _Elt_pointer pCVar18;
  _Map_pointer ppCVar19;
  ConflictPoolPropagation *conflictprop;
  _Map_pointer ppCVar20;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *pvVar21;
  _Elt_pointer this_02;
  double dVar22;
  double dVar23;
  HighsCDouble HVar24;
  HighsCDouble activity;
  HighsCDouble activity_00;
  
  pHVar5 = this->mipsolver->model_;
  piVar6 = (pHVar5->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = piVar6[col];
  lVar13 = (long)iVar3;
  iVar17 = piVar6[(long)col + 1];
  this_00 = &this->objProp_;
  if (((this->objProp_).domain == (HighsDomain *)0x0) ||
     (ObjectivePropagation::updateActivityLbChange(this_00,col,oldbound,newbound),
     this->infeasible_ == false)) {
    if (iVar3 != iVar17) {
      lVar14 = 0;
      do {
        dVar2 = (pHVar5->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar13 + lVar14];
        if (dVar2 <= 0.0) {
          HVar24 = computeDelta(dVar2,oldbound,newbound,-INFINITY,
                                (this->activitymaxinf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start +
                                (pHVar5->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar13 + lVar14]);
          dVar22 = HVar24.hi;
          iVar4 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13 + lVar14];
          pHVar8 = (this->activitymax_).
                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar2 = pHVar8[iVar4].hi;
          activity_00.hi = dVar22 + dVar2;
          pHVar8[iVar4].hi = activity_00.hi;
          activity_00.lo =
               (dVar2 - (activity_00.hi - dVar22)) +
               (dVar22 - (activity_00.hi - (activity_00.hi - dVar22))) + pHVar8[iVar4].lo +
               HVar24.lo;
          pHVar8[iVar4].lo = activity_00.lo;
          if (((this->recordRedundantRows_ == true) &&
              ((pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar4] <= -INFINITY)) &&
             (dVar2 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar4], dVar2 < INFINITY)) {
            updateRedundantRows(this,iVar4,-1,
                                (this->activitymaxinf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar4],activity_00,dVar2);
          }
          if (dVar22 + HVar24.lo < 0.0) {
            piVar6 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar16 = (long)piVar6[lVar13 + lVar14];
            dVar2 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start[lVar16];
            if ((-INFINITY < dVar2) &&
               ((this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16] == 0)) {
              pHVar8 = (this->activitymax_).
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start;
              dVar22 = pHVar8[lVar16].hi;
              dVar23 = dVar2 - dVar22;
              dVar23 = (((dVar2 - (dVar22 + dVar23)) + (-dVar22 - (dVar23 - (dVar22 + dVar23)))) -
                       pHVar8[lVar16].lo) + dVar23;
              pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
              if (*pdVar1 <= dVar23 && dVar23 != *pdVar1) {
                this->infeasible_ = true;
                this->infeasible_pos =
                     (HighsInt)
                     ((ulong)((long)(this->domchgstack_).
                                    super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->domchgstack_).
                                   super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
                RVar12 = (Reason)((ulong)(uint)piVar6[lVar13 + lVar14] << 0x20 | 0xfffffffc);
                goto LAB_00299bdd;
              }
            }
            bVar11 = false;
            if (((this->activitymaxinf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar16] < 2) && (-INFINITY < dVar2))
            goto LAB_00299ca4;
            goto LAB_00299c3f;
          }
LAB_00299bf8:
          updateThresholdLbChange
                    (this,col,newbound,
                     (pHVar5->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar13 + lVar14],
                     (this->capacityThreshold_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar13 + lVar14]);
LAB_00299c3a:
          bVar11 = false;
        }
        else {
          HVar24 = computeDelta(dVar2,oldbound,newbound,-INFINITY,
                                (this->activitymininf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start +
                                (pHVar5->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar13 + lVar14]);
          dVar22 = HVar24.hi;
          iVar4 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13 + lVar14];
          pHVar8 = (this->activitymin_).
                   super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar2 = pHVar8[iVar4].hi;
          activity.hi = dVar22 + dVar2;
          pHVar8[iVar4].hi = activity.hi;
          activity.lo = (dVar2 - (activity.hi - dVar22)) +
                        (dVar22 - (activity.hi - (activity.hi - dVar22))) + pHVar8[iVar4].lo +
                        HVar24.lo;
          pHVar8[iVar4].lo = activity.lo;
          if ((this->recordRedundantRows_ == true) &&
             ((dVar2 = (pHVar5->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar4], -INFINITY < dVar2 &&
              (INFINITY <=
               (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar4])))) {
            updateRedundantRows(this,iVar4,1,
                                (this->activitymininf_).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[iVar4],activity,dVar2);
          }
          if (dVar22 + HVar24.lo <= 0.0) goto LAB_00299bf8;
          piVar6 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar16 = (long)piVar6[lVar13 + lVar14];
          dVar2 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar16];
          if ((dVar2 < INFINITY) &&
             ((this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16] == 0)) {
            pHVar8 = (this->activitymin_).
                     super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar22 = pHVar8[lVar16].hi;
            dVar23 = dVar22 - dVar2;
            dVar23 = (-dVar2 - (dVar23 - dVar22)) + (dVar22 - (dVar23 - (dVar23 - dVar22))) +
                     pHVar8[lVar16].lo + dVar23;
            pdVar1 = &((this->mipsolver->mipdata_)._M_t.
                       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                       .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
            if (*pdVar1 <= dVar23 && dVar23 != *pdVar1) {
              this->infeasible_ = true;
              this->infeasible_pos =
                   (HighsInt)
                   ((ulong)((long)(this->domchgstack_).
                                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->domchgstack_).
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
              RVar12 = (Reason)(((ulong)(uint)piVar6[lVar13 + lVar14] << 0x20) + 0xfffffffd);
LAB_00299bdd:
              this->infeasible_reason = RVar12;
              iVar17 = iVar3 + (int)lVar14 + 1;
              bVar11 = true;
              goto LAB_00299c3f;
            }
          }
          bVar11 = false;
          if (((this->activitymininf_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16] < 2) && (dVar2 < INFINITY)) {
LAB_00299ca4:
            bVar11 = false;
            if ((this->propagateflags_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16] != '\0') goto LAB_00299c3f;
            markPropagate(this,(HighsInt)lVar16);
            goto LAB_00299c3a;
          }
        }
LAB_00299c3f:
      } while ((!bVar11) && (lVar14 = lVar14 + 1, iVar3 + (int)lVar14 != iVar17));
    }
    if (this->infeasible_ == false) {
      this_01 = (this->cutpoolpropagation).
                super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pCVar7 = (this->cutpoolpropagation).
               super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (this_01 != pCVar7) {
        pCVar15 = (this->cutpoolpropagation).
                  super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppCVar20 = (this->cutpoolpropagation).
                   super__Deque_base<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          CutpoolPropagation::updateActivityLbChange(this_01,col,oldbound,newbound);
          this_01 = this_01 + 1;
          if (this_01 == pCVar15) {
            this_01 = ppCVar20[1];
            ppCVar20 = ppCVar20 + 1;
            pCVar15 = this_01 + 3;
          }
        } while (this_01 != pCVar7);
      }
    }
    if (this->infeasible_ == true) {
      if (iVar17 != iVar3) {
        iVar17 = iVar17 - iVar3;
        do {
          dVar2 = (pHVar5->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13];
          pvVar21 = &this->activitymax_;
          pvVar10 = &this->activitymaxinf_;
          if (0.0 < dVar2) {
            pvVar21 = &this->activitymin_;
            pvVar10 = &this->activitymininf_;
          }
          HVar24 = computeDelta(dVar2,newbound,oldbound,-INFINITY,
                                (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start +
                                (pHVar5->a_matrix_).index_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar13]);
          dVar22 = HVar24.hi;
          iVar3 = (pHVar5->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar13];
          pHVar8 = (pvVar21->super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          dVar2 = pHVar8[iVar3].hi;
          dVar23 = dVar22 + dVar2;
          pHVar8[iVar3].hi = dVar23;
          pHVar8[iVar3].lo =
               (dVar2 - (dVar23 - dVar22)) + (dVar22 - (dVar23 - (dVar23 - dVar22))) +
               pHVar8[iVar3].lo + HVar24.lo;
          lVar13 = lVar13 + 1;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      if (this_00->domain != (HighsDomain *)0x0) {
        ObjectivePropagation::updateActivityLbChange(this_00,col,newbound,oldbound);
        return;
      }
    }
    else {
      this_02 = (this->conflictPoolPropagation).
                super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pCVar9 = (this->conflictPoolPropagation).
               super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (this_02 != pCVar9) {
        pCVar18 = (this->conflictPoolPropagation).
                  super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        ppCVar19 = (this->conflictPoolPropagation).
                   super__Deque_base<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          ConflictPoolPropagation::updateActivityLbChange(this_02,col,oldbound,newbound);
          this_02 = this_02 + 1;
          if (this_02 == pCVar18) {
            this_02 = ppCVar19[1];
            ppCVar19 = ppCVar19 + 1;
            pCVar18 = this_02 + 3;
          }
        } while (this_02 != pCVar9);
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::updateActivityLbChange(HighsInt col, double oldbound,
                                         double newbound) {
  auto mip = mipsolver->model_;
  HighsInt start = mip->a_matrix_.start_[col];
  HighsInt end = mip->a_matrix_.start_[col + 1];

  assert(!infeasible_);

  if (objProp_.isActive()) {
    objProp_.updateActivityLbChange(col, oldbound, newbound);
    if (infeasible_) return;
  }

  for (HighsInt i = start; i != end; ++i) {
    if (mip->a_matrix_.value_[i] > 0) {
      HighsCDouble deltamin =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, -kHighsInf,
                       activitymininf_[mip->a_matrix_.index_[i]]);
      activitymin_[mip->a_matrix_.index_[i]] += deltamin;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpminact;
        computeMinActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpminact);
        assert(std::fabs(double(activitymin_[mip->a_matrix_.index_[i]] -
                                tmpminact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymininf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] == kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{1},
                            activitymininf_[mip->a_matrix_.index_[i]],
                            activitymin_[mip->a_matrix_.index_[i]],
                            mip->row_lower_[mip->a_matrix_.index_[i]]);

      if (deltamin <= 0) {
        updateThresholdLbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf &&
          activitymininf_[mip->a_matrix_.index_[i]] == 0 &&
          activitymin_[mip->a_matrix_.index_[i]] -
                  mip->row_upper_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowUpper(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymininf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf)
        markPropagate(mip->a_matrix_.index_[i]);
    } else {
      HighsCDouble deltamax =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, -kHighsInf,
                       activitymaxinf_[mip->a_matrix_.index_[i]]);
      activitymax_[mip->a_matrix_.index_[i]] += deltamax;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpmaxact;
        computeMaxActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpmaxact);
        assert(std::fabs(double(activitymax_[mip->a_matrix_.index_[i]] -
                                tmpmaxact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymaxinf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] == -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{-1},
                            activitymaxinf_[mip->a_matrix_.index_[i]],
                            activitymax_[mip->a_matrix_.index_[i]],
                            mip->row_upper_[mip->a_matrix_.index_[i]]);

      if (deltamax >= 0) {
        updateThresholdLbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          activitymaxinf_[mip->a_matrix_.index_[i]] == 0 &&
          mip->row_lower_[mip->a_matrix_.index_[i]] -
                  activitymax_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowLower(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymaxinf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf)
        markPropagate(mip->a_matrix_.index_[i]);
    }
  }

  if (!infeasible_) {
    for (CutpoolPropagation& cutpoolprop : cutpoolpropagation)
      cutpoolprop.updateActivityLbChange(col, oldbound, newbound);
  } else {
    assert(infeasible_reason.type == Reason::kModelRowLower ||
           infeasible_reason.type == Reason::kModelRowUpper);
    assert(infeasible_reason.index == mip->a_matrix_.index_[end - 1]);
  }

  if (infeasible_) {
    std::swap(oldbound, newbound);
    for (HighsInt i = start; i != end; ++i) {
      if (mip->a_matrix_.value_[i] > 0) {
        activitymin_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         -kHighsInf, activitymininf_[mip->a_matrix_.index_[i]]);
      } else {
        activitymax_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         -kHighsInf, activitymaxinf_[mip->a_matrix_.index_[i]]);
      }
    }

    if (objProp_.isActive()) {
      objProp_.updateActivityLbChange(col, oldbound, newbound);
    }

    return;
  } else {
    for (ConflictPoolPropagation& conflictprop : conflictPoolPropagation)
      conflictprop.updateActivityLbChange(col, oldbound, newbound);
  }
}